

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::StackLayerParams::SerializeWithCachedSizes
          (StackLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
    return;
  }
  return;
}

Assistant:

void StackLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.StackLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.StackLayerParams)
}